

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O0

void array_bool_or(vec<BoolView> *x,vec<BoolView> *y,BoolView *z)

{
  uint uVar1;
  uint uVar2;
  Lit LVar3;
  uint uVar4;
  uint uVar5;
  BoolView *o;
  vec<BoolView> *in_RSI;
  vec<BoolView> *in_RDI;
  uint i_3;
  uint i_2;
  vec<Lit> ps;
  uint i_1;
  uint i;
  BoolView *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  Lit in_stack_ffffffffffffff14;
  BoolView *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  BoolView *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint local_84;
  uint local_7c;
  vec<Lit> local_60;
  int local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Lit in_stack_ffffffffffffffc0;
  Lit in_stack_ffffffffffffffc4;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar1 = vec<BoolView>::size(in_RDI);
    if (uVar1 <= local_1c) break;
    vec<BoolView>::operator[](in_RDI,local_1c);
    operator~(in_stack_ffffffffffffff18);
    BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffffc0 = BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    SAT::addClause((SAT *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    BoolView::~BoolView((BoolView *)0x25fe3d);
    local_1c = local_1c + 1;
  }
  uVar1 = 0;
  while( true ) {
    uVar4 = uVar1;
    uVar2 = vec<BoolView>::size(in_RSI);
    if (uVar2 <= uVar1) break;
    vec<BoolView>::operator[](in_RSI,uVar4);
    LVar3 = BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    local_4c = (int)BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    SAT::addClause((SAT *)CONCAT44(uVar4,LVar3.x),in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
    uVar1 = uVar4 + 1;
  }
  vec<Lit>::vec(&local_60);
  operator~(in_stack_ffffffffffffff18);
  LVar3 = BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
  vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (Lit *)in_stack_ffffffffffffff18);
  BoolView::~BoolView((BoolView *)0x25ff6d);
  local_7c = 0;
  while( true ) {
    uVar1 = local_7c;
    uVar4 = vec<BoolView>::size(in_RDI);
    if (uVar4 <= uVar1) break;
    in_stack_ffffffffffffff30 = vec<BoolView>::operator[](in_RDI,local_7c);
    BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (Lit *)in_stack_ffffffffffffff18);
    local_7c = local_7c + 1;
  }
  local_84 = 0;
  while( true ) {
    uVar2 = local_84;
    uVar5 = vec<BoolView>::size(in_RSI);
    if (uVar5 <= uVar2) break;
    o = vec<BoolView>::operator[](in_RSI,local_84);
    operator~(o);
    in_stack_ffffffffffffff14 = BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff08);
    vec<Lit>::push((vec<Lit> *)CONCAT44(uVar2,in_stack_ffffffffffffff20),(Lit *)o);
    BoolView::~BoolView((BoolView *)0x2600c4);
    local_84 = local_84 + 1;
  }
  SAT::addClause((SAT *)CONCAT44(LVar3.x,uVar4),
                 (vec<Lit> *)CONCAT44(uVar1,in_stack_ffffffffffffff38),
                 SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff14.x,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void array_bool_or(vec<BoolView>& x, vec<BoolView>& y, BoolView z) {
	for (unsigned int i = 0; i < x.size(); i++) {
		sat.addClause(~x[i], z);
	}
	for (unsigned int i = 0; i < y.size(); i++) {
		sat.addClause(y[i], z);
	}
	// Add clause !c \/ a_i \/ !b_i
	vec<Lit> ps;
	ps.push(~z);
	for (unsigned int i = 0; i < x.size(); i++) {
		ps.push(x[i]);
	}
	for (unsigned int i = 0; i < y.size(); i++) {
		ps.push(~y[i]);
	}
	sat.addClause(ps);
}